

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.c
# Opt level: O1

deBool deProcess_start(deProcess *process,char *commandLine,char *workingDirectory)

{
  size_t numBytes;
  long lVar1;
  int iVar2;
  __pid_t __pid;
  deBool dVar3;
  ssize_t sVar4;
  int *piVar5;
  ssize_t sVar6;
  deFile *pdVar7;
  char **__argv;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t extraout_RAX;
  long lVar12;
  int unaff_EBP;
  char *pcVar13;
  ulong uVar14;
  int statusPipe [2];
  int pipeErr [2];
  int pipeOut [2];
  int pipeIn [2];
  int procStatus;
  char errBuf [256];
  int local_150 [9];
  int local_12c;
  char local_128 [256];
  
  local_150[6] = -1;
  local_150[7] = -1;
  local_150[4] = -1;
  local_150[5] = -1;
  local_150[2] = -1;
  local_150[3] = -1;
  local_150[0] = -1;
  local_150[1] = -1;
  if (process->state == PROCESSSTATE_FINISHED) {
    deProcess_cleanupHandles(process);
    process->state = PROCESSSTATE_NOT_STARTED;
  }
  else if (process->state == PROCESSSTATE_RUNNING) {
    deProcess_setError(process,"Process already running");
    return 0;
  }
  iVar2 = pipe(local_150 + 6);
  if ((((iVar2 < 0) || (iVar2 = pipe(local_150 + 4), iVar2 < 0)) ||
      (iVar2 = pipe(local_150 + 2), iVar2 < 0)) || (iVar2 = pipe(local_150), iVar2 < 0)) {
    pcVar13 = "pipe() failed";
LAB_0010f041:
    deProcess_setErrorFromErrno(process,pcVar13);
    closePipe(local_150 + 6);
    closePipe(local_150 + 4);
    closePipe(local_150 + 2);
    closePipe(local_150);
    return 0;
  }
  __pid = fork();
  if (__pid < 0) {
    pcVar13 = "fork() failed";
    goto LAB_0010f041;
  }
  if (__pid != 0) {
    close(local_150[1]);
    sVar4 = read(local_150[0],local_128,1);
    if (sVar4 == -1) {
      piVar5 = __errno_location();
      do {
        if ((*piVar5 != 0xb) && (*piVar5 != 4)) break;
        sVar4 = read(local_150[0],local_128,1);
      } while (sVar4 == -1);
    }
    if (sVar4 < 1) {
      close(local_150[0]);
    }
    else {
      local_12c = 0;
      uVar14 = 1;
      do {
        sVar6 = read(local_150[0],local_128 + uVar14,1);
        if (sVar6 == -1) goto LAB_0010efee;
        uVar14 = uVar14 + 1;
      } while (uVar14 != 0x100);
      uVar14 = 0x100;
LAB_0010efee:
      local_128[uVar14 & 0xffffffff] = '\0';
      close(local_150[0]);
      closePipe(local_150 + 6);
      closePipe(local_150 + 4);
      closePipe(local_150 + 2);
      waitpid(__pid,&local_12c,0);
      deProcess_setError(process,local_128);
    }
    if (0 < sVar4) {
      return 0;
    }
    process->pid = __pid;
    process->state = PROCESSSTATE_RUNNING;
    close(local_150[6]);
    close(local_150[5]);
    close(local_150[3]);
    pdVar7 = deFile_createFromHandle((long)local_150[7]);
    process->standardIn = pdVar7;
    pdVar7 = deFile_createFromHandle((long)local_150[4]);
    process->standardOut = pdVar7;
    pdVar7 = deFile_createFromHandle((long)local_150[2]);
    process->standardErr = pdVar7;
    if (process->standardIn == (deFile *)0x0) {
      close(local_150[7]);
    }
    if (process->standardOut == (deFile *)0x0) {
      close(local_150[4]);
    }
    if (process->standardErr == (deFile *)0x0) {
      close(local_150[2]);
      return 1;
    }
    return 1;
  }
  close(local_150[7]);
  close(local_150[4]);
  close(local_150[2]);
  close(local_150[0]);
  iVar2 = fcntl(local_150[1],2,1);
  if (iVar2 == 0) {
    if ((local_150[6] != 0) && (iVar2 = dup2(local_150[6],0), iVar2 != 0)) goto LAB_0010f20c;
    close(local_150[6]);
    if ((local_150[5] != 1) && (iVar2 = dup2(local_150[5],1), iVar2 != 1)) goto LAB_0010f20c;
    close(local_150[5]);
    if ((local_150[3] != 2) && (iVar2 = dup2(local_150[3],2), iVar2 != 2)) goto LAB_0010f20c;
    close(local_150[3]);
    unaff_EBP = local_150[1];
    commandLine = (char *)deCommandLine_parse(commandLine);
    if ((deCommandLine *)commandLine == (deCommandLine *)0x0) goto LAB_0010f21c;
    __argv = (char **)deCalloc((long)((deCommandLine *)commandLine)->numArgs * 8 + 8);
  }
  else {
    dieLastError(local_150[1],"Failed to set FD_CLOEXEC");
LAB_0010f20c:
    dieLastError(local_150[1],"dup2() failed");
LAB_0010f21c:
    __argv = (char **)0x0;
  }
  if (((deCommandLine *)commandLine == (deCommandLine *)0x0) || (__argv == (char **)0x0)) {
    die(unaff_EBP,"Command line parsing failed (out of memory)");
  }
  else {
    if ((workingDirectory != (char *)0x0) && (iVar2 = chdir(workingDirectory), iVar2 != 0)) {
      pcVar13 = "chdir() failed";
      goto LAB_0010f301;
    }
    iVar2 = ((deCommandLine *)commandLine)->numArgs;
    lVar8 = 0;
    if (0 < (long)iVar2) {
      do {
        __argv[lVar8] = ((deCommandLine *)commandLine)->args[lVar8];
        lVar8 = lVar8 + 1;
      } while (iVar2 != lVar8);
    }
    __argv[lVar8] = (char *)0x0;
    if (workingDirectory == (char *)0x0) goto LAB_0010f269;
  }
  commandLine = *__argv;
  sVar9 = strlen(workingDirectory);
  sVar10 = sVar9 + 1;
  do {
    if (sVar10 == 1) goto LAB_0010f269;
    numBytes = sVar10 - 1;
    lVar8 = sVar10 - 2;
    sVar10 = numBytes;
  } while (workingDirectory[lVar8] == '/');
  dVar3 = deMemoryEqual(commandLine,workingDirectory,numBytes);
  if ((dVar3 != 0) && (*(char *)((long)commandLine + numBytes) == '/')) {
    commandLine = *__argv;
    sVar11 = strlen(workingDirectory);
    sVar9 = strlen(commandLine);
    lVar8 = sVar11 + 1;
    do {
      if (lVar8 == 1) goto LAB_0010f308;
      lVar12 = lVar8 + -1;
      lVar1 = lVar8 + -2;
      lVar8 = lVar12;
      if (workingDirectory[lVar1] != '/') goto LAB_0010f30a;
    } while( true );
  }
LAB_0010f269:
  do {
    execv(*__argv,__argv);
    pcVar13 = "execv() failed";
LAB_0010f301:
    dieLastError(unaff_EBP,pcVar13);
    sVar9 = extraout_RAX;
LAB_0010f308:
    lVar12 = 0;
LAB_0010f30a:
    memmove(commandLine,(char *)((long)&((deCommandLine *)commandLine)->numArgs + lVar12 + 1),
            sVar9 - lVar12);
  } while( true );
}

Assistant:

deBool deProcess_start (deProcess* process, const char* commandLine, const char* workingDirectory)
{
	pid_t		pid				= 0;
	int			pipeIn[2]		= { -1, -1 };
	int			pipeOut[2]		= { -1, -1 };
	int			pipeErr[2]		= { -1, -1 };
	int			statusPipe[2]	= { -1, -1 };

	if (process->state == PROCESSSTATE_RUNNING)
	{
		deProcess_setError(process, "Process already running");
		return DE_FALSE;
	}
	else if (process->state == PROCESSSTATE_FINISHED)
	{
		deProcess_cleanupHandles(process);
		process->state = PROCESSSTATE_NOT_STARTED;
	}

	if (pipe(pipeIn) < 0 || pipe(pipeOut) < 0 || pipe(pipeErr) < 0 || pipe(statusPipe) < 0)
	{
		deProcess_setErrorFromErrno(process, "pipe() failed");

		closePipe(pipeIn);
		closePipe(pipeOut);
		closePipe(pipeErr);
		closePipe(statusPipe);

		return DE_FALSE;
	}

	pid = fork();

	if (pid < 0)
	{
		deProcess_setErrorFromErrno(process, "fork() failed");

		closePipe(pipeIn);
		closePipe(pipeOut);
		closePipe(pipeErr);
		closePipe(statusPipe);

		return DE_FALSE;
	}

	if (pid == 0)
	{
		/* Child process. */

		/* Close unused endpoints. */
		close(pipeIn[1]);
		close(pipeOut[0]);
		close(pipeErr[0]);
		close(statusPipe[0]);

		/* Set status pipe to close on exec(). That way parent will know that exec() succeeded. */
		if (fcntl(statusPipe[1], F_SETFD, FD_CLOEXEC) != 0)
			dieLastError(statusPipe[1], "Failed to set FD_CLOEXEC");

		/* Map stdin. */
		if (pipeIn[0] != STDIN_FILENO &&
			dup2(pipeIn[0], STDIN_FILENO) != STDIN_FILENO)
			dieLastError(statusPipe[1], "dup2() failed");
		close(pipeIn[0]);

		/* Stdout. */
		if (pipeOut[1] != STDOUT_FILENO &&
			dup2(pipeOut[1], STDOUT_FILENO) != STDOUT_FILENO)
			dieLastError(statusPipe[1], "dup2() failed");
		close(pipeOut[1]);

		/* Stderr. */
		if (pipeErr[1] != STDERR_FILENO &&
			dup2(pipeErr[1], STDERR_FILENO) != STDERR_FILENO)
			dieLastError(statusPipe[1], "dup2() failed");
		close(pipeErr[1]);

		/* Doesn't return. */
		execProcess(commandLine, workingDirectory, statusPipe[1]);
	}
	else
	{
		/* Parent process. */

		/* Check status. */
		{
			char	errBuf[256];
			ssize_t	result = 0;

			close(statusPipe[1]);
			while ((result = read(statusPipe[0], errBuf, 1)) == -1)
				if (errno != EAGAIN && errno != EINTR) break;

			if (result > 0)
			{
				int procStatus = 0;

				/* Read full error msg. */
				int errPos = 1;
				while (errPos < DE_LENGTH_OF_ARRAY(errBuf))
				{
					result = read(statusPipe[0], errBuf+errPos, 1);
					if (result == -1)
						break; /* Done. */

					errPos += 1;
				}

				/* Make sure str is null-terminated. */
				errBuf[errPos] = 0;

				/* Close handles. */
				close(statusPipe[0]);
				closePipe(pipeIn);
				closePipe(pipeOut);
				closePipe(pipeErr);

				/* Run waitpid to clean up zombie. */
				waitpid(pid, &procStatus, 0);

				deProcess_setError(process, errBuf);

				return DE_FALSE;
			}

			/* Status pipe is not needed. */
			close(statusPipe[0]);
		}

		/* Set running state. */
		process->pid		= pid;
		process->state		= PROCESSSTATE_RUNNING;

		/* Stdin, stdout. */
		close(pipeIn[0]);
		close(pipeOut[1]);
		close(pipeErr[1]);

		process->standardIn		= deFile_createFromHandle((deUintptr)pipeIn[1]);
		process->standardOut	= deFile_createFromHandle((deUintptr)pipeOut[0]);
		process->standardErr	= deFile_createFromHandle((deUintptr)pipeErr[0]);

		if (!process->standardIn)
			close(pipeIn[1]);

		if (!process->standardOut)
			close(pipeOut[0]);

		if (!process->standardErr)
			close(pipeErr[0]);
	}

	return DE_TRUE;
}